

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int count_users(OBJ_DATA *obj)

{
  int count;
  CHAR_DATA *fch;
  OBJ_DATA *obj_local;
  int local_4;
  
  count = 0;
  if (obj->in_room == (ROOM_INDEX_DATA *)0x0) {
    local_4 = 0;
  }
  else {
    for (fch = obj->in_room->people; fch != (CHAR_DATA *)0x0; fch = fch->next_in_room) {
      if (fch->on == obj) {
        count = count + 1;
      }
    }
    local_4 = count;
  }
  return local_4;
}

Assistant:

int count_users(OBJ_DATA *obj)
{
	CHAR_DATA *fch;
	int count = 0;

	if (obj->in_room == nullptr)
		return 0;

	for (fch = obj->in_room->people; fch != nullptr; fch = fch->next_in_room)
	{
		if (fch->on == obj)
			count++;
	}

	return count;
}